

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxvfmt.cpp
# Opt level: O2

uint32 rw::xbox::makeVertexFmt(int32 flags,uint32 numTexSets)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  
  uVar3 = 4;
  if (numTexSets < 4) {
    uVar3 = numTexSets;
  }
  uVar1 = (flags & 0x10U) * 4 + 5;
  for (iVar2 = 0; uVar3 << 2 != iVar2; iVar2 = iVar2 + 4) {
    uVar1 = uVar1 | 0x500 << ((byte)iVar2 & 0x1f);
  }
  return uVar1 | (flags & 8U) << 0x15;
}

Assistant:

uint32
makeVertexFmt(int32 flags, uint32 numTexSets)
{
	if(numTexSets > 4)
		numTexSets = 4;
	uint32 fmt = 0x5;	// FLOAT3
	if(flags & Geometry::NORMALS)
		fmt |= 0x40;	// NORMPACKED3
	for(uint32 i = 0; i < numTexSets; i++)
		fmt |= 0x500 << i*4;	// FLOAT2
	if(flags & Geometry::PRELIT)
		fmt |= 0x1000000;	// D3DCOLOR
	return fmt;
}